

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

int pushParseTest(char *filename,char *result,char *err,int options)

{
  long lVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  int size;
  char *base;
  uint local_4c;
  char *local_48;
  char *local_40;
  char *local_38;
  
  nb_tests = nb_tests + 1;
  iVar4 = loadMem(filename,&local_48,(int *)&local_4c);
  uVar3 = local_4c;
  if (iVar4 == 0) {
    uVar5 = 4;
    if ((int)local_4c < 4) {
      uVar5 = local_4c;
    }
    local_40 = result;
    local_38 = err;
    if (((uint)options >> 0x1e & 1) == 0) {
      lVar6 = xmlCreatePushParserCtxt(0,0,local_48,uVar5,filename);
    }
    else {
      lVar6 = htmlCreatePushParserCtxt(0,0,local_48,uVar5,filename,0);
    }
    xmlCtxtSetErrorHandler(lVar6,testStructuredErrorHandler,0);
    xmlCtxtUseOptions(lVar6,options);
    uVar5 = 4;
    if ((int)uVar3 < 4) {
      uVar5 = uVar3;
    }
    lVar9 = (long)(int)uVar5 << 0x20;
    lVar7 = (long)(int)uVar5;
    do {
      lVar1 = lVar7 + 0x400;
      if ((int)local_4c <= lVar1) {
        if (((uint)options >> 0x1e & 1) == 0) {
          xmlParseChunk();
        }
        else {
          htmlParseChunk(lVar6,local_48 + (lVar9 >> 0x20),(ulong)local_4c - lVar7,1);
        }
        break;
      }
      if (((uint)options >> 0x1e & 1) == 0) {
        xmlParseChunk();
      }
      else {
        htmlParseChunk(lVar6,local_48 + lVar7,0x400,0);
      }
      lVar9 = lVar9 + 0x40000000000;
      lVar7 = lVar1;
    } while (lVar1 < (int)local_4c);
    uVar2 = *(undefined8 *)(lVar6 + 0x10);
    if (((uint)options >> 0x1e & 1) == 0) {
      iVar4 = *(int *)(lVar6 + 0x18);
      xmlFreeParserCtxt(lVar6);
      free(local_48);
      if (iVar4 == 0) {
        xmlFreeDoc(uVar2);
        pcVar8 = "Failed to parse %s\n";
        goto LAB_001098bc;
      }
    }
    else {
      xmlFreeParserCtxt(lVar6);
      free(local_48);
    }
    if (((uint)options >> 0x1e & 1) == 0) {
      xmlDocDumpMemory();
    }
    else {
      htmlDocDumpMemory(uVar2,&local_48,&local_4c);
    }
    pcVar8 = local_40;
    xmlFreeDoc(uVar2);
    iVar4 = compareFileMem(pcVar8,local_48,local_4c);
    if ((local_48 == (char *)0x0) || (iVar4 != 0)) {
      if (local_48 != (char *)0x0) {
        (*_xmlFree)();
      }
      fprintf(_stderr,"Result for %s failed in %s\n",filename,pcVar8);
      return -1;
    }
    (*_xmlFree)();
    if (local_38 == (char *)0x0) {
      return 0;
    }
    iVar4 = compareFileMem(local_38,testErrors,testErrorsSize);
    if (iVar4 == 0) {
      return 0;
    }
    pcVar8 = "Error for %s failed\n";
  }
  else {
    pcVar8 = "Failed to load %s\n";
  }
LAB_001098bc:
  fprintf(_stderr,pcVar8,filename);
  return -1;
}

Assistant:

static int
pushParseTest(const char *filename, const char *result,
             const char *err ATTRIBUTE_UNUSED,
	     int options) {
    xmlParserCtxtPtr ctxt;
    xmlDocPtr doc;
    const char *base;
    int size, res;
    int cur = 0;
    int chunkSize = 4;

    nb_tests++;
    /*
     * load the document in memory and work from there.
     */
    if (loadMem(filename, &base, &size) != 0) {
        fprintf(stderr, "Failed to load %s\n", filename);
	return(-1);
    }

    if (chunkSize > size)
        chunkSize = size;

#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML)
	ctxt = htmlCreatePushParserCtxt(NULL, NULL, base + cur, chunkSize, filename,
	                                XML_CHAR_ENCODING_NONE);
    else
#endif
    ctxt = xmlCreatePushParserCtxt(NULL, NULL, base + cur, chunkSize, filename);
    xmlCtxtSetErrorHandler(ctxt, testStructuredErrorHandler, NULL);
    xmlCtxtUseOptions(ctxt, options);
    cur += chunkSize;
    chunkSize = 1024;
    do {
        if (cur + chunkSize >= size) {
#ifdef LIBXML_HTML_ENABLED
	    if (options & XML_PARSE_HTML)
		htmlParseChunk(ctxt, base + cur, size - cur, 1);
	    else
#endif
	    xmlParseChunk(ctxt, base + cur, size - cur, 1);
	    break;
	} else {
#ifdef LIBXML_HTML_ENABLED
	    if (options & XML_PARSE_HTML)
		htmlParseChunk(ctxt, base + cur, chunkSize, 0);
	    else
#endif
	    xmlParseChunk(ctxt, base + cur, chunkSize, 0);
	    cur += chunkSize;
	}
    } while (cur < size);
    doc = ctxt->myDoc;
#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML)
        res = 1;
    else
#endif
    res = ctxt->wellFormed;
    xmlFreeParserCtxt(ctxt);
    free((char *)base);
    if (!res) {
	xmlFreeDoc(doc);
	fprintf(stderr, "Failed to parse %s\n", filename);
	return(-1);
    }
#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML)
	htmlDocDumpMemory(doc, (xmlChar **) &base, &size);
    else
#endif
    xmlDocDumpMemory(doc, (xmlChar **) &base, &size);
    xmlFreeDoc(doc);
    res = compareFileMem(result, base, size);
    if ((base == NULL) || (res != 0)) {
	if (base != NULL)
	    xmlFree((char *)base);
        fprintf(stderr, "Result for %s failed in %s\n", filename, result);
	return(-1);
    }
    xmlFree((char *)base);
    if (err != NULL) {
	res = compareFileMem(err, testErrors, testErrorsSize);
	if (res != 0) {
	    fprintf(stderr, "Error for %s failed\n", filename);
	    return(-1);
	}
    }
    return(0);
}